

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O3

CoverageType
tcu::calculateTriangleCoverage
          (Vec4 *p0,Vec4 *p1,Vec4 *p2,IVec2 *pixel,IVec2 *viewportSize,int subpixelBits,
          bool multisample)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  CoverageType CVar5;
  ulong uVar6;
  ulong uVar7;
  long *plVar8;
  byte bVar9;
  long *plVar10;
  uint uVar11;
  long *plVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  ulong uVar16;
  Vec4 *pVVar17;
  long lVar18;
  byte bVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long sqSum_1;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  bool bVar28;
  uint uVar29;
  float fVar30;
  float fVar31;
  float fVar33;
  undefined1 auVar32 [16];
  float fVar34;
  undefined1 auVar35 [16];
  int iVar37;
  undefined1 auVar36 [16];
  float fVar38;
  int iVar39;
  float fVar41;
  undefined1 auVar40 [16];
  float fVar42;
  undefined1 auVar43 [16];
  float fVar44;
  float fVar46;
  undefined1 auVar45 [16];
  I64Vec2 pixelCorners [4];
  I64Vec2 pixelCenterCorners [4];
  long local_120 [3];
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  long lStack_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  long alStack_b0 [4];
  long lStack_90;
  undefined8 local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  
  bVar19 = (byte)subpixelBits;
  uVar25 = 1L << (bVar19 & 0x3f);
  uVar7 = 4;
  if (multisample) {
    uVar7 = uVar25;
  }
  fVar34 = p1->m_data[0];
  fVar30 = p0->m_data[3];
  fVar31 = p2->m_data[0];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)p0->m_data;
  auVar40._4_4_ = fVar30;
  auVar40._0_4_ = fVar30;
  auVar40._8_4_ = fVar30;
  auVar40._12_4_ = fVar30;
  auVar32 = divps(auVar32,auVar40);
  fVar30 = auVar32._0_4_;
  fVar33 = auVar32._4_4_;
  fVar42 = (p2->m_data[1] / p2->m_data[3] - fVar33) * (fVar34 / p1->m_data[3] - fVar30) -
           (fVar31 / p2->m_data[3] - fVar30) * (p1->m_data[1] / p1->m_data[3] - fVar33);
  uVar29 = -(uint)(0.0 < fVar42);
  auVar45._0_4_ = ~uVar29 & (uint)fVar31 | uVar29 & (uint)fVar34;
  pVVar17 = p2;
  if (fVar42 <= 0.0) {
    pVVar17 = p1;
    p1 = p2;
    fVar31 = fVar34;
  }
  fVar34 = p1->m_data[3];
  fVar42 = pVVar17->m_data[3];
  fVar38 = (float)(int)*(undefined8 *)viewportSize->m_data;
  fVar41 = (float)(int)((ulong)*(undefined8 *)viewportSize->m_data >> 0x20);
  fVar30 = (fVar30 + 1.0) * 0.5 * fVar38;
  fVar33 = (fVar33 + 1.0) * 0.5 * fVar41;
  auVar45._4_4_ = p1->m_data[1];
  auVar45._8_8_ = 0;
  auVar35._4_4_ = fVar34;
  auVar35._0_4_ = fVar34;
  auVar35._8_4_ = fVar34;
  auVar35._12_4_ = fVar34;
  auVar32 = divps(auVar45,auVar35);
  fVar44 = (auVar32._0_4_ + 1.0) * 0.5 * fVar38;
  fVar46 = (auVar32._4_4_ + 1.0) * 0.5 * fVar41;
  auVar43._4_4_ = pVVar17->m_data[1];
  auVar43._0_4_ = fVar31;
  auVar43._8_8_ = 0;
  auVar36._4_4_ = fVar42;
  auVar36._0_4_ = fVar42;
  auVar36._8_4_ = fVar42;
  auVar36._12_4_ = fVar42;
  auVar32 = divps(auVar43,auVar36);
  fVar38 = (auVar32._0_4_ + 1.0) * 0.5 * fVar38;
  fVar41 = (auVar32._4_4_ + 1.0) * 0.5 * fVar41;
  fVar34 = (float)(-(uint)(fVar44 <= fVar30) & (uint)fVar30 |
                  ~-(uint)(fVar44 <= fVar30) & (uint)fVar44);
  uVar29 = -(uint)(fVar38 <= fVar34);
  iVar1 = pixel->m_data[0];
  CVar5 = COVERAGE_NONE;
  if (((float)iVar1 <= (float)(~uVar29 & (uint)fVar38 | uVar29 & (uint)fVar34) + 1.0) &&
     (fVar34 = (float)(~-(uint)(fVar30 <= fVar44) & (uint)fVar44 |
                      -(uint)(fVar30 <= fVar44) & (uint)fVar30), uVar29 = -(uint)(fVar34 <= fVar38),
     (float)(~uVar29 & (uint)fVar38 | uVar29 & (uint)fVar34) + -1.0 <= (float)iVar1)) {
    fVar34 = (float)(~-(uint)(fVar46 <= fVar33) & (uint)fVar46 |
                    -(uint)(fVar46 <= fVar33) & (uint)fVar33);
    uVar29 = -(uint)(fVar41 <= fVar34);
    iVar2 = pixel->m_data[1];
    if (((float)iVar2 <= (float)(~uVar29 & (uint)fVar41 | uVar29 & (uint)fVar34) + 1.0) &&
       (fVar34 = (float)(~-(uint)(fVar33 <= fVar46) & (uint)fVar46 |
                        (uint)fVar33 & -(uint)(fVar33 <= fVar46)),
       uVar29 = -(uint)(fVar34 <= fVar41),
       (float)(~uVar29 & (uint)fVar41 | uVar29 & (uint)fVar34) + -1.0 <= (float)iVar2)) {
      lVar20 = (long)iVar1 << (bVar19 & 0x3f);
      alStack_b0[0] = (long)iVar2 << (bVar19 & 0x3f);
      fVar34 = (float)uVar25;
      local_78 = lVar20 + (uVar25 >> 1);
      local_70 = (uVar25 >> 1) + alStack_b0[0];
      fVar30 = fVar30 * fVar34;
      iVar39 = (int)((float)(~-(uint)(fVar30 < 0.0) & 0x3f000000 |
                            -(uint)(fVar30 < 0.0) & 0xbf000000) + fVar30);
      local_b8 = CONCAT44(-(uint)(iVar39 < 0),iVar39);
      fVar44 = fVar44 * fVar34;
      iVar39 = (int)((float)(~-(uint)(fVar44 < 0.0) & 0x3f000000 |
                            -(uint)(fVar44 < 0.0) & 0xbf000000) + fVar44);
      alStack_b0[1] = CONCAT44(-(uint)(iVar39 < 0),iVar39);
      fVar38 = fVar38 * fVar34;
      fVar41 = fVar41 * fVar34;
      iVar39 = (int)((float)(~-(uint)(fVar38 < 0.0) & 0x3f000000 |
                            -(uint)(fVar38 < 0.0) & 0xbf000000) + fVar38);
      iVar37 = (int)((float)(~-(uint)(fVar41 < 0.0) & 0x3f000000 |
                            -(uint)(fVar41 < 0.0) & 0xbf000000) + fVar41);
      bVar9 = 2;
      if (multisample) {
        bVar9 = bVar19;
      }
      lVar22 = uVar7 << (bVar9 & 0x3f);
      alStack_b0[3] = CONCAT44(-(uint)(iVar39 < 0),iVar39);
      local_88 = CONCAT44(-(uint)(iVar37 < 0),iVar37);
      bVar28 = true;
      uVar7 = 0;
      do {
        while( true ) {
          uVar6 = uVar7 + 1;
          uVar25 = 0;
          if (uVar6 != 3) {
            uVar25 = uVar6 & 0xffffffff;
          }
          lVar27 = alStack_b0[uVar25 * 2 + -1] - alStack_b0[uVar7 * 2 + -1];
          lVar26 = alStack_b0[uVar25 * 2] - alStack_b0[uVar7 * 2];
          lVar13 = (alStack_b0[uVar7 * 2 + -1] - local_78) * lVar26 +
                   (local_70 - alStack_b0[uVar7 * 2]) * lVar27;
          uVar7 = uVar6;
          if (-1 < lVar13) break;
          lVar24 = 0;
          bVar28 = true;
          do {
            bVar15 = bVar28;
            lVar24 = lVar24 + lVar27 * lVar27;
            lVar27 = lVar26;
            bVar28 = false;
          } while (bVar15);
          lVar24 = lVar24 * lVar22;
          if (lVar13 * lVar13 - lVar24 != 0 && lVar24 <= lVar13 * lVar13) goto LAB_0091ce2e;
LAB_0091c93c:
          bVar28 = false;
          if (uVar6 == 3) goto LAB_0091c963;
        }
        lVar24 = 0;
        bVar15 = true;
        do {
          bVar14 = bVar15;
          lVar24 = lVar24 + lVar27 * lVar27;
          lVar27 = lVar26;
          bVar15 = false;
        } while (bVar14);
        if (lVar13 * lVar13 < lVar24 * lVar22) goto LAB_0091c93c;
      } while (uVar6 != 3);
      CVar5 = COVERAGE_FULL;
      if (!bVar28) {
LAB_0091c963:
        alStack_b0[1] = (long)(iVar1 + 1) << (bVar19 & 0x3f);
        lStack_90 = (long)(iVar2 + 1) << (bVar19 & 0x3f);
        local_68 = local_78 + 1;
        local_50 = local_70 + 1;
        local_b8 = lVar20;
        alStack_b0[2] = alStack_b0[0];
        alStack_b0[3] = alStack_b0[1];
        local_88 = lVar20;
        local_80 = lStack_90;
        local_60 = local_70;
        local_58 = local_68;
        local_48 = local_78;
        local_40 = local_50;
        fVar31 = floorf(fVar30);
        fVar42 = floorf(fVar33 * fVar34);
        local_120[1] = CONCAT44(-(uint)((int)fVar31 < 0),(int)fVar31);
        local_108 = CONCAT44(-(uint)((int)fVar42 < 0),(int)fVar42);
        fVar31 = floorf(fVar44);
        fVar42 = floorf(fVar46 * fVar34);
        local_108 = CONCAT44(-(uint)((int)fVar31 < 0),(int)fVar31);
        local_f8 = CONCAT44(-(uint)((int)fVar42 < 0),(int)fVar42);
        fVar31 = floorf(fVar38);
        fVar42 = floorf(fVar41);
        local_f8 = CONCAT44(-(uint)((int)fVar31 < 0),(int)fVar31);
        local_e8 = CONCAT44(-(uint)((int)fVar42 < 0),(int)fVar42);
        fVar31 = ceilf(fVar30);
        fVar30 = ceilf(fVar33 * fVar34);
        local_e8 = CONCAT44(-(uint)((int)fVar31 < 0),(int)fVar31);
        local_d8 = CONCAT44(-(uint)((int)fVar30 < 0),(int)fVar30);
        fVar31 = ceilf(fVar44);
        fVar34 = ceilf(fVar46 * fVar34);
        local_d8 = CONCAT44(-(uint)((int)fVar31 < 0),(int)fVar31);
        local_c8 = CONCAT44(-(uint)((int)fVar34 < 0),(int)fVar34);
        fVar34 = ceilf(fVar38);
        fVar31 = ceilf(fVar41);
        plVar10 = &local_78;
        if (multisample) {
          plVar10 = &local_b8;
        }
        local_c8 = CONCAT44(-(uint)((int)fVar34 < 0),(int)fVar34);
        local_b8 = CONCAT44(-(uint)((int)fVar31 < 0),(int)fVar31);
        bVar28 = false;
        uVar7 = 0;
        do {
          uVar25 = uVar7 + 1;
          uVar6 = 0;
          if (uVar25 != 3) {
            uVar6 = uVar25 & 0xffffffff;
          }
          uVar29 = 0;
          do {
            plVar12 = local_120 + 1;
            if ((uVar29 & 1) == 0) {
              plVar12 = &local_e8;
            }
            lVar20 = plVar12[uVar7 * 2];
            plVar12 = local_120 + 2;
            if (uVar29 < 2) {
              plVar12 = &lStack_e0;
            }
            lVar22 = plVar12[uVar7 * 2];
            uVar11 = 0;
            do {
              plVar12 = local_120 + 1;
              if ((uVar11 & 1) == 0) {
                plVar12 = &local_e8;
              }
              plVar4 = local_120 + 2;
              if (uVar11 < 2) {
                plVar4 = &lStack_e0;
              }
              lVar13 = plVar12[uVar6 * 2] - lVar20;
              lVar26 = plVar4[uVar6 * 2] - lVar22;
              lVar27 = 1;
              plVar8 = plVar10 + 1;
              do {
                uVar16 = (ulong)(((uint)lVar27 & 3) << 4);
                lVar24 = plVar8[-1];
                lVar3 = *plVar8;
                lVar23 = *(long *)((long)plVar10 + uVar16);
                lVar18 = *(long *)((long)plVar10 + uVar16 + 8);
                uVar21 = (lVar20 - lVar24) * lVar26 + (lVar3 - lVar22) * lVar13;
                uVar16 = (lVar20 - lVar23) * lVar26 + (lVar18 - lVar22) * lVar13;
                if ((-1 < (long)(uVar16 & uVar21)) && (((long)uVar21 < 1 || ((long)uVar16 < 1)))) {
                  lVar23 = lVar23 - lVar24;
                  lVar18 = lVar18 - lVar3;
                  uVar16 = (lVar24 - lVar20) * lVar18 + (lVar22 - lVar3) * lVar23;
                  uVar21 = (lVar24 - plVar12[uVar6 * 2]) * lVar18 +
                           (plVar4[uVar6 * 2] - lVar3) * lVar23;
                  if ((-1 < (long)(uVar21 & uVar16)) && (((long)uVar16 < 1 || ((long)uVar21 < 1))))
                  {
                    if (!bVar28) {
                      return COVERAGE_PARTIAL;
                    }
                    goto LAB_0091cda3;
                  }
                }
                plVar8 = plVar8 + 2;
                lVar27 = lVar27 + 1;
              } while (lVar27 != 5);
              uVar11 = uVar11 + 1;
            } while (uVar11 != 4);
            uVar29 = uVar29 + 1;
          } while (uVar29 != 4);
          bVar28 = 1 < uVar7;
          uVar7 = uVar25;
        } while (uVar25 != 3);
LAB_0091cda3:
        plVar12 = &local_78;
        if (multisample) {
          plVar12 = &local_b8;
        }
        lVar20 = 1;
        lVar22 = 8;
        do {
          if (lVar20 == 4) {
            return COVERAGE_FULL;
          }
          lVar27 = lVar20;
          if (lVar22 == 0x28) {
            lVar27 = 0;
          }
          plVar4 = (long *)((long)local_120 + lVar22);
          lVar13 = lVar22 + 8;
          lVar20 = lVar20 + 1;
          lVar22 = lVar22 + 0x10;
        } while (-1 < (plVar12[1] - local_120[lVar27 * 2 + 2]) *
                      (local_120[lVar27 * 2 + 1] - *plVar4) +
                      (*(long *)((long)local_120 + lVar13) - local_120[lVar27 * 2 + 2]) *
                      (*plVar10 - local_120[lVar27 * 2 + 1]));
LAB_0091ce2e:
        CVar5 = COVERAGE_NONE;
      }
    }
  }
  return CVar5;
}

Assistant:

CoverageType calculateTriangleCoverage (const tcu::Vec4& p0, const tcu::Vec4& p1, const tcu::Vec4& p2, const tcu::IVec2& pixel, const tcu::IVec2& viewportSize, int subpixelBits, bool multisample)
{
	typedef tcu::Vector<deInt64, 2> I64Vec2;

	const deUint64		numSubPixels						= ((deUint64)1) << subpixelBits;
	const deUint64		pixelHitBoxSize						= (multisample) ? (numSubPixels) : (2+2);	//!< allow 4 central (2x2) for non-multisample pixels. Rounding may move edges 1 subpixel to any direction.
	const bool			order								= isTriangleClockwise(p0, p1, p2);			//!< clockwise / counter-clockwise
	const tcu::Vec4&	orderedP0							= p0;										//!< vertices of a clockwise triangle
	const tcu::Vec4&	orderedP1							= (order) ? (p1) : (p2);
	const tcu::Vec4&	orderedP2							= (order) ? (p2) : (p1);
	const tcu::Vec2		triangleNormalizedDeviceSpace[3]	=
	{
		tcu::Vec2(orderedP0.x() / orderedP0.w(), orderedP0.y() / orderedP0.w()),
		tcu::Vec2(orderedP1.x() / orderedP1.w(), orderedP1.y() / orderedP1.w()),
		tcu::Vec2(orderedP2.x() / orderedP2.w(), orderedP2.y() / orderedP2.w()),
	};
	const tcu::Vec2		triangleScreenSpace[3]				=
	{
		(triangleNormalizedDeviceSpace[0] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
		(triangleNormalizedDeviceSpace[1] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
		(triangleNormalizedDeviceSpace[2] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
	};

	// Broad bounding box - pixel check
	{
		const float minX = de::min(de::min(triangleScreenSpace[0].x(), triangleScreenSpace[1].x()), triangleScreenSpace[2].x());
		const float minY = de::min(de::min(triangleScreenSpace[0].y(), triangleScreenSpace[1].y()), triangleScreenSpace[2].y());
		const float maxX = de::max(de::max(triangleScreenSpace[0].x(), triangleScreenSpace[1].x()), triangleScreenSpace[2].x());
		const float maxY = de::max(de::max(triangleScreenSpace[0].y(), triangleScreenSpace[1].y()), triangleScreenSpace[2].y());

		if ((float)pixel.x() > maxX + 1 ||
			(float)pixel.y() > maxY + 1 ||
			(float)pixel.x() < minX - 1 ||
			(float)pixel.y() < minY - 1)
			return COVERAGE_NONE;
	}

	// Broad triangle - pixel area intersection
	{
		const I64Vec2 pixelCenterPosition = I64Vec2(pixel.x(), pixel.y()) * I64Vec2(numSubPixels, numSubPixels) + I64Vec2(numSubPixels / 2, numSubPixels / 2);
		const I64Vec2 triangleSubPixelSpaceRound[3] =
		{
			I64Vec2(deRoundFloatToInt32(triangleScreenSpace[0].x() * (float)numSubPixels), deRoundFloatToInt32(triangleScreenSpace[0].y() * (float)numSubPixels)),
			I64Vec2(deRoundFloatToInt32(triangleScreenSpace[1].x() * (float)numSubPixels), deRoundFloatToInt32(triangleScreenSpace[1].y() * (float)numSubPixels)),
			I64Vec2(deRoundFloatToInt32(triangleScreenSpace[2].x() * (float)numSubPixels), deRoundFloatToInt32(triangleScreenSpace[2].y() * (float)numSubPixels)),
		};

		// Check (using cross product) if pixel center is
		// a) too far from any edge
		// b) fully inside all edges
		bool insideAllEdges = true;
		for (int vtxNdx = 0; vtxNdx < 3; ++vtxNdx)
		{
			const int		otherVtxNdx				= (vtxNdx + 1) % 3;
			const deInt64	maxPixelDistanceSquared	= pixelHitBoxSize*pixelHitBoxSize; // Max distance from the pixel center from within the pixel is (sqrt(2) * boxWidth/2). Use 2x value for rounding tolerance
			const I64Vec2	edge					= triangleSubPixelSpaceRound[otherVtxNdx]	- triangleSubPixelSpaceRound[vtxNdx];
			const I64Vec2	v						= pixelCenterPosition						- triangleSubPixelSpaceRound[vtxNdx];
			const deInt64	crossProduct			= (edge.x() * v.y() - edge.y() * v.x());

			// distance from edge: (edge x v) / |edge|
			//     (edge x v) / |edge| > maxPixelDistance
			// ==> (edge x v)^2 / edge^2 > maxPixelDistance^2    | edge x v > 0
			// ==> (edge x v)^2 > maxPixelDistance^2 * edge^2
			if (crossProduct < 0 && crossProduct*crossProduct > maxPixelDistanceSquared * tcu::lengthSquared(edge))
				return COVERAGE_NONE;
			if (crossProduct < 0 || crossProduct*crossProduct < maxPixelDistanceSquared * tcu::lengthSquared(edge))
				insideAllEdges = false;
		}

		if (insideAllEdges)
			return COVERAGE_FULL;
	}

	// Accurate intersection for edge pixels
	{
		//  In multisampling, the sample points can be anywhere in the pixel, and in single sampling only in the center.
		const I64Vec2 pixelCorners[4] =
		{
			I64Vec2((pixel.x()+0) * numSubPixels, (pixel.y()+0) * numSubPixels),
			I64Vec2((pixel.x()+1) * numSubPixels, (pixel.y()+0) * numSubPixels),
			I64Vec2((pixel.x()+1) * numSubPixels, (pixel.y()+1) * numSubPixels),
			I64Vec2((pixel.x()+0) * numSubPixels, (pixel.y()+1) * numSubPixels),
		};
		const I64Vec2 pixelCenterCorners[4] =
		{
			I64Vec2(pixel.x() * numSubPixels + numSubPixels/2 + 0, pixel.y() * numSubPixels + numSubPixels/2 + 0),
			I64Vec2(pixel.x() * numSubPixels + numSubPixels/2 + 1, pixel.y() * numSubPixels + numSubPixels/2 + 0),
			I64Vec2(pixel.x() * numSubPixels + numSubPixels/2 + 1, pixel.y() * numSubPixels + numSubPixels/2 + 1),
			I64Vec2(pixel.x() * numSubPixels + numSubPixels/2 + 0, pixel.y() * numSubPixels + numSubPixels/2 + 1),
		};

		// both rounding directions
		const I64Vec2 triangleSubPixelSpaceFloor[3] =
		{
			I64Vec2(deFloorFloatToInt32(triangleScreenSpace[0].x() * (float)numSubPixels), deFloorFloatToInt32(triangleScreenSpace[0].y() * (float)numSubPixels)),
			I64Vec2(deFloorFloatToInt32(triangleScreenSpace[1].x() * (float)numSubPixels), deFloorFloatToInt32(triangleScreenSpace[1].y() * (float)numSubPixels)),
			I64Vec2(deFloorFloatToInt32(triangleScreenSpace[2].x() * (float)numSubPixels), deFloorFloatToInt32(triangleScreenSpace[2].y() * (float)numSubPixels)),
		};
		const I64Vec2 triangleSubPixelSpaceCeil[3] =
		{
			I64Vec2(deCeilFloatToInt32(triangleScreenSpace[0].x() * (float)numSubPixels), deCeilFloatToInt32(triangleScreenSpace[0].y() * (float)numSubPixels)),
			I64Vec2(deCeilFloatToInt32(triangleScreenSpace[1].x() * (float)numSubPixels), deCeilFloatToInt32(triangleScreenSpace[1].y() * (float)numSubPixels)),
			I64Vec2(deCeilFloatToInt32(triangleScreenSpace[2].x() * (float)numSubPixels), deCeilFloatToInt32(triangleScreenSpace[2].y() * (float)numSubPixels)),
		};
		const I64Vec2* const corners = (multisample) ? (pixelCorners) : (pixelCenterCorners);

		// Test if any edge (with any rounding) intersects the pixel (boundary). If it does => Partial. If not => fully inside or outside

		for (int edgeNdx = 0; edgeNdx < 3; ++edgeNdx)
		for (int startRounding = 0; startRounding < 4; ++startRounding)
		for (int endRounding = 0; endRounding < 4; ++endRounding)
		{
			const int		nextEdgeNdx	= (edgeNdx+1) % 3;
			const I64Vec2	startPos	((startRounding&0x01)	? (triangleSubPixelSpaceFloor[edgeNdx].x())		: (triangleSubPixelSpaceCeil[edgeNdx].x()),		(startRounding&0x02)	? (triangleSubPixelSpaceFloor[edgeNdx].y())		: (triangleSubPixelSpaceCeil[edgeNdx].y()));
			const I64Vec2	endPos		((endRounding&0x01)		? (triangleSubPixelSpaceFloor[nextEdgeNdx].x())	: (triangleSubPixelSpaceCeil[nextEdgeNdx].x()),	(endRounding&0x02)		? (triangleSubPixelSpaceFloor[nextEdgeNdx].y())	: (triangleSubPixelSpaceCeil[nextEdgeNdx].y()));

			for (int pixelEdgeNdx = 0; pixelEdgeNdx < 4; ++pixelEdgeNdx)
			{
				const int pixelEdgeEnd = (pixelEdgeNdx + 1) % 4;

				if (lineLineIntersect(startPos, endPos, corners[pixelEdgeNdx], corners[pixelEdgeEnd]))
					return COVERAGE_PARTIAL;
			}
		}

		// fully inside or outside
		for (int edgeNdx = 0; edgeNdx < 3; ++edgeNdx)
		{
			const int		nextEdgeNdx		= (edgeNdx+1) % 3;
			const I64Vec2&	startPos		= triangleSubPixelSpaceFloor[edgeNdx];
			const I64Vec2&	endPos			= triangleSubPixelSpaceFloor[nextEdgeNdx];
			const I64Vec2	edge			= endPos - startPos;
			const I64Vec2	v				= corners[0] - endPos;
			const deInt64	crossProduct	= (edge.x() * v.y() - edge.y() * v.x());

			// a corner of the pixel is outside => "fully inside" option is impossible
			if (crossProduct < 0)
				return COVERAGE_NONE;
		}

		return COVERAGE_FULL;
	}
}